

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileLibraryTargetGenerator.cxx
# Opt level: O0

void __thiscall
cmMakefileLibraryTargetGenerator::WriteFrameworkRules
          (cmMakefileLibraryTargetGenerator *this,bool relink)

{
  cmGeneratorTarget *this_00;
  cmLocalUnixMakefileGenerator3 *this_01;
  string local_150;
  allocator<char> local_129;
  string local_128;
  undefined1 local_108 [8];
  string extraFlags;
  cmAlphaNum local_b8;
  undefined1 local_88 [8];
  string linkRuleVar;
  string local_58;
  undefined1 local_38 [8];
  string linkLanguage;
  bool relink_local;
  cmMakefileLibraryTargetGenerator *this_local;
  
  this_00 = (this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget;
  linkLanguage.field_2._M_local_buf[0xf] = relink;
  cmMakefileTargetGenerator::GetConfigName_abi_cxx11_
            (&local_58,&this->super_cmMakefileTargetGenerator);
  cmGeneratorTarget::GetLinkerLanguage((string *)local_38,this_00,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  cmAlphaNum::cmAlphaNum(&local_b8,"CMAKE_");
  cmAlphaNum::cmAlphaNum((cmAlphaNum *)((long)&extraFlags.field_2 + 8),(string *)local_38);
  cmStrCat<char[25]>((string *)local_88,&local_b8,(cmAlphaNum *)((long)&extraFlags.field_2 + 8),
                     (char (*) [25])"_CREATE_MACOSX_FRAMEWORK");
  std::__cxx11::string::string((string *)local_108);
  cmMakefileTargetGenerator::GetTargetLinkFlags
            (&this->super_cmMakefileTargetGenerator,(string *)local_108,(string *)local_38);
  this_01 = (this->super_cmMakefileTargetGenerator).LocalGenerator;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_128,"CMAKE_MACOSX_FRAMEWORK_LINKER_FLAGS",&local_129);
  cmMakefileTargetGenerator::GetConfigName_abi_cxx11_
            (&local_150,&this->super_cmMakefileTargetGenerator);
  cmLocalGenerator::AddConfigVariableFlags
            ((cmLocalGenerator *)this_01,(string *)local_108,&local_128,&local_150);
  std::__cxx11::string::~string((string *)&local_150);
  std::__cxx11::string::~string((string *)&local_128);
  std::allocator<char>::~allocator(&local_129);
  WriteLibraryRules(this,(string *)local_88,(string *)local_108,
                    (bool)(linkLanguage.field_2._M_local_buf[0xf] & 1));
  std::__cxx11::string::~string((string *)local_108);
  std::__cxx11::string::~string((string *)local_88);
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

void cmMakefileLibraryTargetGenerator::WriteFrameworkRules(bool relink)
{
  std::string linkLanguage =
    this->GeneratorTarget->GetLinkerLanguage(this->GetConfigName());
  std::string linkRuleVar =
    cmStrCat("CMAKE_", linkLanguage, "_CREATE_MACOSX_FRAMEWORK");

  std::string extraFlags;
  this->GetTargetLinkFlags(extraFlags, linkLanguage);
  this->LocalGenerator->AddConfigVariableFlags(
    extraFlags, "CMAKE_MACOSX_FRAMEWORK_LINKER_FLAGS", this->GetConfigName());

  this->WriteLibraryRules(linkRuleVar, extraFlags, relink);
}